

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

int64_t tar_atol_base_n(char *p,size_t char_cnt,wchar_t base)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  char *local_60;
  int local_50;
  wchar_t local_4c;
  wchar_t sign;
  wchar_t digit;
  int64_t last_digit_limit;
  int64_t limit;
  int64_t maxval;
  int64_t l;
  size_t sStack_20;
  wchar_t base_local;
  size_t char_cnt_local;
  char *p_local;
  
  limit = 0x7fffffffffffffff;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
  last_digit_limit = SUB168((auVar2 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)base),0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
  _sign = SUB168((auVar3 << 0x40 | ZEXT816(0x7fffffffffffffff)) % SEXT816((long)base),0);
  sStack_20 = char_cnt;
  char_cnt_local = (size_t)p;
  while( true ) {
    bVar6 = false;
    if ((sStack_20 != 0) && (bVar6 = true, *(char *)char_cnt_local != ' ')) {
      bVar6 = *(char *)char_cnt_local == '\t';
    }
    if (!bVar6) break;
    char_cnt_local = char_cnt_local + 1;
    sStack_20 = sStack_20 - 1;
  }
  local_50 = 1;
  if ((sStack_20 != 0) && (*(char *)char_cnt_local == '-')) {
    local_50 = -1;
    char_cnt_local = char_cnt_local + 1;
    sStack_20 = sStack_20 - 1;
    limit = -0x8000000000000000;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
    last_digit_limit =
         -SUB168((auVar4 << 0x40 | ZEXT816(0x8000000000000000)) / SEXT816((long)base),0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
    _sign = -SUB168((auVar5 << 0x40 | ZEXT816(0x8000000000000000)) % SEXT816((long)base),0);
  }
  maxval = 0;
  if (sStack_20 == 0) {
LAB_0014d3ca:
    if (local_50 < 0) {
      local_60 = (char *)-maxval;
    }
    else {
      local_60 = (char *)maxval;
    }
    p_local = local_60;
  }
  else {
    cVar1 = *(char *)char_cnt_local;
    while( true ) {
      local_4c = cVar1 + L'\xffffffd0';
      bVar6 = false;
      if ((L'\xffffffff' < local_4c) && (bVar6 = false, local_4c < base)) {
        bVar6 = sStack_20 != 0;
      }
      if (!bVar6) goto LAB_0014d3ca;
      if ((last_digit_limit < maxval) || ((maxval == last_digit_limit && (_sign <= local_4c))))
      break;
      maxval = maxval * base + (long)local_4c;
      cVar1 = *(char *)(char_cnt_local + 1);
      sStack_20 = sStack_20 - 1;
      char_cnt_local = char_cnt_local + 1;
    }
    p_local = (char *)limit;
  }
  return (int64_t)p_local;
}

Assistant:

static int64_t
tar_atol_base_n(const char *p, size_t char_cnt, int base)
{
	int64_t	l, maxval, limit, last_digit_limit;
	int digit, sign;

	maxval = INT64_MAX;
	limit = INT64_MAX / base;
	last_digit_limit = INT64_MAX % base;

	/* the pointer will not be dereferenced if char_cnt is zero
	 * due to the way the && operator is evaluated.
	 */
	while (char_cnt != 0 && (*p == ' ' || *p == '\t')) {
		p++;
		char_cnt--;
	}

	sign = 1;
	if (char_cnt != 0 && *p == '-') {
		sign = -1;
		p++;
		char_cnt--;

		maxval = INT64_MIN;
		limit = -(INT64_MIN / base);
		last_digit_limit = -(INT64_MIN % base);
	}

	l = 0;
	if (char_cnt != 0) {
		digit = *p - '0';
		while (digit >= 0 && digit < base  && char_cnt != 0) {
			if (l>limit || (l == limit && digit >= last_digit_limit)) {
				return maxval; /* Truncate on overflow. */
			}
			l = (l * base) + digit;
			digit = *++p - '0';
			char_cnt--;
		}
	}
	return (sign < 0) ? -l : l;
}